

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

pair<bool,_int> Fixpp::impl::matchTag<Fixpp::TagT<9u,Fixpp::Type::Int>,int>(StreamCursor *cursor)

{
  StreamBuf<char> *pSVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  pair<bool,_int> pVar7;
  size_t count;
  int unaff_R12D;
  bool bVar8;
  byte *pbVar9;
  bool bVar10;
  uint local_34 [2];
  int ret;
  
  pSVar1 = cursor->buf;
  uVar2 = *(undefined8 *)&pSVar1->field_0x8;
  lVar3 = *(long *)&pSVar1->field_0x10;
  lVar4 = *(long *)&pSVar1->field_0x18;
  if ((lVar4 == lVar3) && (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 == 0)) {
    bVar10 = false;
  }
  else {
    pSVar1 = cursor->buf;
    pbVar9 = *(byte **)&pSVar1->field_0x10;
    lVar6 = *(long *)&pSVar1->field_0x18 - (long)pbVar9;
    if (lVar6 == 0) {
      lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))();
    }
    count = 0;
    unaff_R12D = 0;
    do {
      if ((byte)(*pbVar9 - 0x30) < 10) {
        unaff_R12D = (uint)*pbVar9 + unaff_R12D * 10 + -0x30;
        count = count + 1;
        lVar6 = lVar6 + -1;
        bVar10 = lVar6 != 0;
      }
      else {
        bVar10 = false;
      }
      pbVar9 = pbVar9 + 1;
    } while (bVar10);
    bVar10 = count != 0;
    if (bVar10) {
      bVar10 = true;
      StreamCursor::advance(cursor,count);
    }
  }
  bVar8 = true;
  pVar7.first = false;
  pVar7._1_3_ = 0;
  pVar7.second = 0;
  if ((bVar10) && (unaff_R12D == 9)) {
    pSVar1 = cursor->buf;
    if ((*(long *)&pSVar1->field_0x18 != *(long *)&pSVar1->field_0x10) ||
       (lVar6 = (**(code **)(*(long *)pSVar1 + 0x38))(), lVar6 != 0)) {
      pSVar1 = cursor->buf;
      if (*(char **)&pSVar1->field_0x10 < *(char **)&pSVar1->field_0x18) {
        cVar5 = **(char **)&pSVar1->field_0x10;
      }
      else {
        cVar5 = (**(code **)(*(long *)pSVar1 + 0x48))();
      }
      if (cVar5 == '=') {
        StreamCursor::advance(cursor,1);
        bVar10 = TagMatcher<Fixpp::Type::Int>::matchValue((Return *)local_34,cursor);
        bVar8 = !bVar10;
        pVar7.first = false;
        pVar7._1_3_ = 0;
        pVar7.second = 0;
        if (bVar10) {
          pVar7 = (pair<bool,_int>)(((ulong)local_34[0] << 0x20) + 1);
        }
        goto LAB_008d9092;
      }
    }
    pVar7.first = false;
    pVar7._1_3_ = 0;
    pVar7.second = 0;
  }
LAB_008d9092:
  if (bVar8) {
    pSVar1 = cursor->buf;
    *(undefined8 *)&pSVar1->field_0x8 = uVar2;
    *(long *)&pSVar1->field_0x10 = lVar3;
    *(long *)&pSVar1->field_0x18 = lVar4;
  }
  return pVar7;
}

Assistant:

std::pair<bool, Ret> matchTag(StreamCursor& cursor)
        {
            #define TRY_MATCH(...) \
            if (!__VA_ARGS__) \
               return std::make_pair(false, Ret {})

            StreamCursor::Revert revert(cursor);

            int tag;
            TRY_MATCH(match_int_fast(&tag, cursor));

            if (tag != Tag::Id)
               return std::make_pair(false, Ret {});

            TRY_MATCH(match_literal_fast('=', cursor));

            Ret ret;

            TRY_MATCH(TagMatcher<typename Tag::Type>::matchValue(&ret, cursor));

            revert.ignore();

            return std::make_pair(true, ret);

            #undef TRY_MATCH
        }